

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

int __thiscall Catch::TestCaseTracking::TrackerBase::close(TrackerBase *this,int __fd)

{
  pointer psVar1;
  ITracker *pIVar2;
  pointer psVar3;
  int iVar4;
  TrackerContext *pTVar5;
  long lVar6;
  long lVar7;
  pointer psVar8;
  string local_70;
  ReusableStringStream local_50;
  SourceLineInfo local_38;
  
  pTVar5 = this->m_ctx;
  while ((TrackerBase *)pTVar5->m_currentTracker != this) {
    (*(((TrackerBase *)pTVar5->m_currentTracker)->super_ITracker)._vptr_ITracker[8])();
    pTVar5 = this->m_ctx;
  }
  switch(this->m_runState) {
  case NotStarted:
  case CompletedSuccessfully:
  case Failed:
    ReusableStringStream::ReusableStringStream(&local_50);
    local_38.file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/discretedynamics[P]cyclone/build_O3/_deps/catch2-src/single_include/catch2/catch.hpp"
    ;
    local_38.line = 0x3890;
    operator<<(local_50.m_oss,&local_38);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_50.m_oss,": Internal Catch2 error: ",0x19);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_50.m_oss,"Illogical state: ",0x11);
    std::ostream::operator<<(local_50.m_oss,this->m_runState);
    std::__cxx11::stringbuf::str();
    throw_logic_error(&local_70);
  case Executing:
    goto switchD_00126fce_caseD_1;
  case ExecutingChildren:
    psVar8 = (this->m_children).
             super__Vector_base<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar1 = (this->m_children).
             super__Vector_base<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar6 = (long)psVar1 - (long)psVar8;
    if (0 < lVar6 >> 6) {
      lVar7 = (lVar6 >> 6) + 1;
      psVar3 = psVar8 + 2;
      do {
        psVar8 = psVar3;
        iVar4 = (*(psVar8[-2].
                   super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->_vptr_ITracker[2])();
        if ((char)iVar4 == '\0') {
          psVar8 = psVar8 + -2;
          goto LAB_0012709a;
        }
        iVar4 = (*(psVar8[-1].
                   super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->_vptr_ITracker[2])();
        if ((char)iVar4 == '\0') {
          psVar8 = psVar8 + -1;
          goto LAB_0012709a;
        }
        iVar4 = (*((psVar8->
                   super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr)->_vptr_ITracker[2])();
        if ((char)iVar4 == '\0') goto LAB_0012709a;
        iVar4 = (*(psVar8[1].
                   super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->_vptr_ITracker[2])();
        if ((char)iVar4 == '\0') {
          psVar8 = psVar8 + 1;
          goto LAB_0012709a;
        }
        lVar7 = lVar7 + -1;
        lVar6 = lVar6 + -0x40;
        psVar3 = psVar8 + 4;
      } while (1 < lVar7);
      psVar8 = psVar8 + 2;
    }
    lVar6 = lVar6 >> 4;
    if (lVar6 == 1) {
LAB_00127079:
      iVar4 = (*((psVar8->
                 super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->_vptr_ITracker[2])();
      if ((char)iVar4 != '\0') {
        psVar8 = psVar1;
      }
    }
    else if (lVar6 == 2) {
LAB_00127068:
      iVar4 = (*((psVar8->
                 super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->_vptr_ITracker[2])();
      if ((char)iVar4 != '\0') {
        psVar8 = psVar8 + 1;
        goto LAB_00127079;
      }
    }
    else {
      if (lVar6 != 3) goto switchD_00126fce_caseD_1;
      iVar4 = (*((psVar8->
                 super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->_vptr_ITracker[2])();
      if ((char)iVar4 != '\0') {
        psVar8 = psVar8 + 1;
        goto LAB_00127068;
      }
    }
LAB_0012709a:
    if (psVar8 != psVar1) goto switchD_00126fce_caseD_3;
switchD_00126fce_caseD_1:
    this->m_runState = CompletedSuccessfully;
switchD_00126fce_caseD_3:
    pIVar2 = this->m_parent;
    if (pIVar2 == (ITracker *)0x0) {
      __assert_fail("m_parent",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/discretedynamics[P]cyclone/build_O3/_deps/catch2-src/single_include/catch2/catch.hpp"
                    ,0x38a4,"void Catch::TestCaseTracking::TrackerBase::moveToParent()");
    }
    pTVar5 = this->m_ctx;
    pTVar5->m_currentTracker = pIVar2;
    pTVar5->m_runState = CompletedCycle;
    return (int)pIVar2;
  case NeedsAnotherRun:
    goto switchD_00126fce_caseD_3;
  default:
    ReusableStringStream::ReusableStringStream(&local_50);
    local_38.file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/discretedynamics[P]cyclone/build_O3/_deps/catch2-src/single_include/catch2/catch.hpp"
    ;
    local_38.line = 0x3893;
    operator<<(local_50.m_oss,&local_38);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_50.m_oss,": Internal Catch2 error: ",0x19);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_50.m_oss,"Unknown state: ",0xf);
    std::ostream::operator<<(local_50.m_oss,this->m_runState);
    std::__cxx11::stringbuf::str();
    throw_logic_error(&local_70);
  }
}

Assistant:

void TrackerBase::close() {

        // Close any still open children (e.g. generators)
        while( &m_ctx.currentTracker() != this )
            m_ctx.currentTracker().close();

        switch( m_runState ) {
            case NeedsAnotherRun:
                break;

            case Executing:
                m_runState = CompletedSuccessfully;
                break;
            case ExecutingChildren:
                if( std::all_of(m_children.begin(), m_children.end(), [](ITrackerPtr const& t){ return t->isComplete(); }) )
                    m_runState = CompletedSuccessfully;
                break;

            case NotStarted:
            case CompletedSuccessfully:
            case Failed:
                CATCH_INTERNAL_ERROR( "Illogical state: " << m_runState );

            default:
                CATCH_INTERNAL_ERROR( "Unknown state: " << m_runState );
        }
        moveToParent();
        m_ctx.completeCycle();
    }